

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_CCtx_refCDict(ZSTD_CCtx *cctx,ZSTD_CDict *cdict)

{
  undefined8 in_RSI;
  long in_RDI;
  undefined8 local_8;
  
  if (*(int *)(in_RDI + 0xe00) == 0) {
    ZSTD_clearAllDicts((ZSTD_CCtx *)cdict);
    *(undefined8 *)(in_RDI + 0xe58) = in_RSI;
    local_8 = 0;
  }
  else {
    local_8 = 0xffffffffffffffc4;
  }
  return local_8;
}

Assistant:

size_t ZSTD_CCtx_refCDict(ZSTD_CCtx* cctx, const ZSTD_CDict* cdict)
{
    RETURN_ERROR_IF(cctx->streamStage != zcss_init, stage_wrong,
                    "Can't ref a dict when ctx not in init stage.");
    /* Free the existing local cdict (if any) to save memory. */
    ZSTD_clearAllDicts(cctx);
    cctx->cdict = cdict;
    return 0;
}